

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O2

void __thiscall QInputDialogPrivate::ensureLayout(QInputDialogPrivate *this)

{
  QWidget *parent;
  QLabel *pQVar1;
  QDialogButtonBox *this_00;
  QLayout *this_01;
  QAbstractSpinBox *spinBox;
  QWidget *buddy;
  long in_FS_OFFSET;
  undefined1 local_58 [16];
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->mainLayout == (QVBoxLayout *)0x0) {
    parent = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    buddy = this->inputWidget;
    if (buddy == (QWidget *)0x0) {
      ensureLineEdit(this);
      buddy = &this->lineEdit->super_QWidget;
      this->inputWidget = buddy;
    }
    pQVar1 = this->label;
    if (pQVar1 == (QLabel *)0x0) {
      pQVar1 = (QLabel *)operator_new(0x28);
      QInputDialog::tr((QString *)&local_48,"Enter a value:",(char *)0x0,-1);
      QLabel::QLabel(pQVar1,(QString *)&local_48,parent,(WindowFlags)0x0);
      this->label = pQVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      pQVar1 = this->label;
      buddy = this->inputWidget;
    }
    QLabel::setBuddy(pQVar1,buddy);
    QWidget::setSizePolicy((QWidget *)this->label,(QSizePolicy)0x10000);
    this_00 = (QDialogButtonBox *)operator_new(0x28);
    QDialogButtonBox::QDialogButtonBox(this_00,(StandardButtons)0x400400,Horizontal,parent);
    this->buttonBox = (QDialogButtonBox *)this_00;
    local_48.d = (Data *)0x1b9;
    local_48.ptr = (char16_t *)0x0;
    QObject::connect<void(QDialogButtonBox::*)(),void(QDialog::*)()>
              ((Object *)(local_58 + 8),(offset_in_QDialogButtonBox_to_subr)this_00,
               (ContextType *)QDialogButtonBox::accepted,(offset_in_QDialog_to_subr *)0x0,
               (ConnectionType)parent);
    QMetaObject::Connection::~Connection((Connection *)(local_58 + 8));
    local_48.d = (Data *)0x1c1;
    local_48.ptr = (char16_t *)0x0;
    QObject::connect<void(QDialogButtonBox::*)(),void(QDialog::*)()>
              ((Object *)local_58,(offset_in_QDialogButtonBox_to_subr)this->buttonBox,
               (ContextType *)QDialogButtonBox::rejected,(offset_in_QDialog_to_subr *)0x0,
               (ConnectionType)parent);
    QMetaObject::Connection::~Connection((Connection *)local_58);
    this_01 = (QLayout *)operator_new(0x20);
    QVBoxLayout::QVBoxLayout((QVBoxLayout *)this_01,parent);
    this->mainLayout = (QVBoxLayout *)this_01;
    QLayout::setSizeConstraint(this_01,SetMinAndMaxSize);
    QBoxLayout::addWidget
              (&this->mainLayout->super_QBoxLayout,(QWidget *)this->label,0,(Alignment)0x0);
    QBoxLayout::addWidget(&this->mainLayout->super_QBoxLayout,this->inputWidget,0,(Alignment)0x0);
    QBoxLayout::addWidget
              (&this->mainLayout->super_QBoxLayout,&this->buttonBox->super_QWidget,0,(Alignment)0x0)
    ;
    spinBox = QtPrivate::qobject_cast_helper<QAbstractSpinBox*,QObject>
                        (&this->inputWidget->super_QObject);
    ensureEnabledConnection(this,spinBox);
    QWidget::show(this->inputWidget);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::ensureLayout()
{
    Q_Q(QInputDialog);

    if (mainLayout)
        return;

    if (!inputWidget) {
        ensureLineEdit();
        inputWidget = lineEdit;
    }

    if (!label)
        label = new QLabel(QInputDialog::tr("Enter a value:"), q);
#ifndef QT_NO_SHORTCUT
    label->setBuddy(inputWidget);
#endif
    label->setSizePolicy(QSizePolicy::Minimum, QSizePolicy::Fixed);

    buttonBox = new QDialogButtonBox(QDialogButtonBox::Ok | QDialogButtonBox::Cancel, Qt::Horizontal, q);
    QObject::connect(buttonBox, &QDialogButtonBox::accepted, q, &QDialog::accept);
    QObject::connect(buttonBox, &QDialogButtonBox::rejected, q, &QDialog::reject);

    mainLayout = new QVBoxLayout(q);
    mainLayout->setSizeConstraint(QLayout::SetMinAndMaxSize);
    mainLayout->addWidget(label);
    mainLayout->addWidget(inputWidget);
    mainLayout->addWidget(buttonBox);
    ensureEnabledConnection(qobject_cast<QAbstractSpinBox *>(inputWidget));
    inputWidget->show();
}